

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O1

double YP_md_get_wheel_vref(YPSpur *spur,double *wr,double *wl)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_50;
  
  local_50.msg_type = 1;
  local_50.pid = (long)spur->pid;
  local_50.type = 0x79;
  local_50.cs = 0;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_50);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_50), -1 < iVar1)) {
    *wr = local_50.data[0];
    *wl = local_50.data[1];
    return local_50.data[2];
  }
  spur->connection_error = 1;
  return -1.0;
}

Assistant:

double YP_md_get_wheel_vref(YPSpur* spur, double* wr, double* wl)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_WHEEL_VREF;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *wr = msg.data[0];
  *wl = msg.data[1];
  time = msg.data[2];
  return time;
}